

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O2

cmSourceGroup * __thiscall cmSourceGroup::MatchChildrenFiles(cmSourceGroup *this,string *name)

{
  pointer pcVar1;
  bool bVar2;
  pointer this_00;
  
  bVar2 = MatchesFiles(this,name);
  if (!bVar2) {
    this_00 = (this->Internal->GroupChildren).
              super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
              super__Vector_impl_data._M_start;
    pcVar1 = (this->Internal->GroupChildren).
             super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      if (this_00 == pcVar1) {
        return (cmSourceGroup *)0x0;
      }
      this = MatchChildrenFiles(this_00,name);
      this_00 = this_00 + 1;
    } while (this == (cmSourceGroup *)0x0);
  }
  return this;
}

Assistant:

cmSourceGroup* cmSourceGroup::MatchChildrenFiles(const std::string& name)
{
  if (this->MatchesFiles(name)) {
    return this;
  }
  for (cmSourceGroup& group : this->Internal->GroupChildren) {
    cmSourceGroup* result = group.MatchChildrenFiles(name);
    if (result) {
      return result;
    }
  }
  return nullptr;
}